

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

double __thiscall NEST::LArNEST::GetDriftVelocity_Liquid(LArNEST *this,double Kelvin,double efield)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if ((Kelvin < 84.0) || (140.0 < Kelvin)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n",0x35)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Using value at closest temp for a drift speed estimate\n",0x37
              );
    Kelvin = *(double *)(&DAT_001188d0 + (ulong)(Kelvin < 84.0) * 8);
  }
  pdVar3 = (this->fDriftParameters).A.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->fDriftParameters).A.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  if (lVar4 != 1) {
    lVar5 = 0;
    do {
      if (((this->fDriftParameters).TempLow.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar5] <= Kelvin) &&
         (Kelvin < (this->fDriftParameters).TempHigh.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5 + 1])) {
        dVar7 = (this->fDriftParameters).B.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5];
        dVar1 = pdVar3[lVar5];
        dVar2 = (this->fDriftParameters).C.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5];
        dVar6 = log(efield / 1000.0);
        dVar7 = exp(dVar6 * dVar2 + dVar7 / (efield / 1000.0) + dVar1);
        if (0.0 < dVar7) {
          return dVar7;
        }
        return 0.0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + -1 != lVar5);
  }
  return 0.0;
}

Assistant:

double LArNEST::GetDriftVelocity_Liquid(double Kelvin, double efield) {
  // returns drift speed in mm/usec. based on Fig. 14 arXiv:1712.08607
  if (Kelvin < 84. || Kelvin > 140.) {
    cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n";
    cerr << "Using value at closest temp for a drift speed estimate\n";
    if (Kelvin < 84.) {
      Kelvin = 84.;
    } else {
      Kelvin = 140.;
    }
  }
  for (size_t i = 0; i < fDriftParameters.A.size() - 1; i++) {
    if (Kelvin >= fDriftParameters.TempLow[i] and
        Kelvin < fDriftParameters.TempHigh[i + 1]) {
      double speed =
          exp(fDriftParameters.A[i] + fDriftParameters.B[i] / (efield / 1000) +
              fDriftParameters.C[i] * log(efield / 1000));
      if (speed > 0.0) {
        return speed;
      } else {
        return 0.0;
      }
    }
  }
  return 0.0;
}